

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Remote.cpp
# Opt level: O2

void XPMP2::RmtSendMain(void)

{
  bool bVar1;
  uint __i;
  int iVar2;
  long lVar3;
  NetRuntimeError *pNVar4;
  XPMP2Error *this;
  UDPMulticast *this_00;
  int iVar5;
  allocator<char> local_ed;
  int local_ec;
  string from;
  fd_set sRead;
  
  if (glob < 1) {
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Remote.cpp"
           ,0x2ad,"RmtSendMain",logDEBUG,"Sender thread started");
  }
  local_ec = 0;
  this_00 = gpMc;
  do {
    if (this_00 == (UDPMulticast *)0x0) {
      this = (XPMP2Error *)__cxa_allocate_exception(0x78);
      XPMP2Error::XPMP2Error
                (this,
                 "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Remote.cpp"
                 ,0x2b2,"RmtSendMain","ASSERT FAILED: %s","gpMc != nullptr");
      __cxa_throw(this,&XPMP2Error::typeinfo,XPMP2Error::~XPMP2Error);
    }
    DAT_002cc79c = 1;
    UDPMulticast::Join(this_00,(string *)&DAT_002cc738,DAT_002cc758,(string *)&DAT_002cc760,
                       DAT_002cc780,DAT_002cc788,0);
    iVar5 = (gpMc->super_SocketNetworking).f_socket;
    iVar2 = pipe(&gSelfPipe);
    if (iVar2 < 0) {
      pNVar4 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sRead,"Couldn\'t create self-pipe",(allocator<char> *)&from);
      NetRuntimeError::NetRuntimeError(pNVar4,(string *)&sRead);
      __cxa_throw(pNVar4,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
    }
    fcntl(gSelfPipe,4,0x800);
    iVar5 = iVar5 + 1;
    iVar2 = gSelfPipe + 1;
    if (gSelfPipe + 1 < iVar5) {
      iVar2 = iVar5;
    }
    if (glob < 2) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Remote.cpp"
             ,0x2c5,"RmtSendMain",logINFO,
             "Listening to %s, waiting for someone being interested in our data...",
             (gpMc->multicastAddr)._M_dataplus._M_p);
    }
    do {
      bVar1 = RmtSendContinue();
      if (!bVar1) goto LAB_002022c5;
      for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
        sRead.fds_bits[lVar3] = 0;
      }
      iVar5 = (gpMc->super_SocketNetworking).f_socket;
      sRead.fds_bits[iVar5 / 0x40] = sRead.fds_bits[iVar5 / 0x40] | 1L << ((byte)iVar5 & 0x3f);
      sRead.fds_bits[gSelfPipe / 0x40] =
           sRead.fds_bits[gSelfPipe / 0x40] | 1L << ((byte)gSelfPipe & 0x3f);
      iVar5 = select(iVar2,(fd_set *)&sRead,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
      bVar1 = RmtSendContinue();
      if (!bVar1) goto LAB_002022c5;
      if (iVar5 == -1) {
        pNVar4 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&from,"\'select\' failed",&local_ed);
        NetRuntimeError::NetRuntimeError(pNVar4,&from);
        __cxa_throw(pNVar4,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
      }
    } while ((iVar5 < 1) ||
            (iVar5 = (gpMc->super_SocketNetworking).f_socket,
            ((ulong)sRead.fds_bits[iVar5 / 0x40] >> ((long)iVar5 % 0x40 & 0x3fU) & 1) == 0));
    from._M_dataplus._M_p = (pointer)&from.field_2;
    from._M_string_length = 0;
    from.field_2._M_local_buf[0] = '\0';
    UDPMulticast::RecvMC(gpMc,true,&from,(SockAddrTy *)0x0,(bool *)0x0);
    if (glob < 2) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Remote.cpp"
             ,0x2e4,"RmtSendMain",logINFO,"Received word from %s, will start sending aircraft data",
             from._M_dataplus._M_p);
    }
    DAT_002cc79c = 2;
    std::__cxx11::string::~string((string *)&from);
LAB_002022c5:
    for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 4) {
      if (*(int *)((long)&gSelfPipe + lVar3) != -1) {
        close(*(int *)((long)&gSelfPipe + lVar3));
      }
      *(undefined4 *)((long)&gSelfPipe + lVar3) = 0xffffffff;
    }
    bVar1 = RmtSendContinue();
    if (bVar1) {
      RmtSendLoop();
    }
    if (gpMc == (UDPMulticast *)0x0) {
      this_00 = (UDPMulticast *)0x0;
    }
    else {
      (*(gpMc->super_SocketNetworking)._vptr_SocketNetworking[4])();
      this_00 = gpMc;
    }
    if (4 < local_ec) {
      if (glob < 5) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Remote.cpp"
               ,0x30a,"RmtSendMain",logFATAL,"Too many errors, I give up on remote functionality!");
      }
      gbRemoteGaveUp = 1;
      goto LAB_00202547;
    }
    if (gbStopMCThread == '\x01') {
LAB_00202547:
      DAT_002cc79c = 0;
      gbStopMCThread = '\x01';
      if (glob < 1) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Remote.cpp"
               ,0x313,"RmtSendMain",logDEBUG,"Sender thread stopping");
      }
      return;
    }
  } while( true );
}

Assistant:

void RmtSendMain()
{
    // This is a thread main function, set thread's name
    SET_THREAD_NAME("XPMP2_Send");
    LOG_MSG(logDEBUG, "Sender thread started");
    int cntMCErr = 0;                       ///< error counter for network thread
    
    do {
        try {
            LOG_ASSERT(gpMc != nullptr);
            
            // Set global status to: we are "waiting" for some action on the multicast group
            glob.remoteStatus = REMOTE_SEND_WAITING;
            
            // Create a multicast socket and listen if there is any traffic in our multicast group
            gpMc->Join(glob.remoteMCGroup, glob.remotePort, glob.remoteSendIntf,
                       glob.remoteTTL, glob.remoteBufSize);
            int maxSock = (int)gpMc->getSocket() + 1;
#if APL == 1 || LIN == 1
            // the self-pipe to shut down the TCP socket gracefully
            if (pipe(gSelfPipe) < 0)
                throw NetRuntimeError("Couldn't create self-pipe");
            fcntl(gSelfPipe[0], F_SETFL, O_NONBLOCK);
            maxSock = std::max(maxSock, gSelfPipe[0]+1);
#endif
            
            // *** Main listening loop ***
            
            LOG_MSG(logINFO, INFO_MC_SEND_WAIT, gpMc->GetMCAddr().c_str());
            
            while (RmtSendContinue())
            {
                // wait for some signal on either socket (multicast or self-pipe)
                fd_set sRead;
                FD_ZERO(&sRead);
                FD_SET(gpMc->getSocket(), &sRead);      // check our socket
#if APL == 1 || LIN == 1
                FD_SET(gSelfPipe[0], &sRead);        // check the self-pipe
#endif
                int retval = select(maxSock, &sRead, NULL, NULL, NULL);
                
                // short-cut if we are to shut down (return from 'select' due to closed socket)
                if (!RmtSendContinue())
                    break;
                
                // select call failed???
                if (retval == -1)
                    throw NetRuntimeError("'select' failed");
                
                // select successful - there is multicast data!
                if (retval > 0 && FD_ISSET(gpMc->getSocket(), &sRead))
                {
                    // We aren't actually interested in the data as such,
                    // the fact that there was _any_ traffic already means:
                    // there is someone out there interested in our data.
                    // We just read received multicast to clear out the buffers
                    // and switch the sending interface to the interface we received from.
                    std::string from;
                    gpMc->RecvMC(true, &from);
                    LOG_MSG(logINFO, INFO_MC_SEND_RCVD, from.c_str());
                    
                    // Set global status to: we are about to send data, also exits listening loop
                    glob.remoteStatus = REMOTE_SENDING;
                    break;
                }
            }
            
#if APL == 1 || LIN == 1
            // close the self-pipe sockets
            for (SOCKET &s: gSelfPipe) {
                if (s != INVALID_SOCKET) close(s);
                s = INVALID_SOCKET;
            }
#endif
            // Continue? Then send data!
            if (RmtSendContinue())
                RmtSendLoop();
        }
        catch (std::exception& e) {
            ++cntMCErr;
            LOG_MSG(logERR, ERR_MC_THREAD, e.what());
            
#if APL == 1 || LIN == 1
            // close the self-pipe sockets
            for (SOCKET &s: gSelfPipe) {
                if (s != INVALID_SOCKET) close(s);
                s = INVALID_SOCKET;
            }
#endif
        }
        
        // close the multicast socket
        if (gpMc)
            gpMc->Close();
        
        // Error count too high?
        if (cntMCErr >= MC_MAX_ERR) {
            LOG_MSG(logFATAL, ERR_MC_MAX);
            gbRemoteGaveUp = true;          // the SENDER gives up after too many errors
        }
    }
    while (!gbStopMCThread && cntMCErr < MC_MAX_ERR);
        
    // make sure the end of the thread is recognized and joined
    glob.remoteStatus = REMOTE_OFF;
    gbStopMCThread = true;
    LOG_MSG(logDEBUG, "Sender thread stopping");
}